

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O0

void drop_weapon(int alone)

{
  obj *obj;
  char *pcVar1;
  obj *local_30;
  obj *wep;
  obj *otmp2;
  obj *otmp;
  int alone_local;
  
  obj = uwep;
  if (uwep != (obj *)0x0) {
    if (((alone == 0) || (((youmonst.data)->mflags1 & 0x2000) != 0)) ||
       ((youmonst.data)->msize == '\0')) {
      if (alone != 0) {
        pcVar1 = "";
        if (u.twoweap != '\0') {
          pcVar1 = "s";
        }
        pline("You find you must drop your weapon%s!",pcVar1);
      }
      if (u.twoweap == '\0') {
        local_30 = (obj *)0x0;
      }
      else {
        local_30 = uswapwep;
      }
      uwepgone();
      if (((*(uint *)&obj->field_0x4a & 1) == 0) || (obj->otyp != 0x210)) {
        dropx(obj);
      }
      if ((local_30 != (obj *)0x0) &&
         ((uswapwepgone(), (*(uint *)&local_30->field_0x4a & 1) == 0 || (local_30->otyp != 0x210))))
      {
        dropx(local_30);
      }
      untwoweapon();
    }
    else if ((youmonst.data)->mattk[1].aatyp != 0xfe) {
      untwoweapon();
    }
  }
  return;
}

Assistant:

static void drop_weapon(int alone)
{
    struct obj *otmp;
    struct obj *otmp2;

    if ((otmp = uwep) != 0) {
	/* !alone check below is currently superfluous but in the
	 * future it might not be so if there are monsters which cannot
	 * wear gloves but can wield weapons
	 */
	if (!alone || cantwield(youmonst.data)) {
	    struct obj *wep = uwep;

	    if (alone) pline("You find you must drop your weapon%s!",
			   	u.twoweap ? "s" : "");
	    otmp2 = u.twoweap ? uswapwep : 0;
	    uwepgone();
	    if (!wep->cursed || wep->otyp != LOADSTONE)
		dropx(otmp);
	    if (otmp2 != 0) {
		uswapwepgone();
		if (!otmp2->cursed || otmp2->otyp != LOADSTONE)
		    dropx(otmp2);
	    }
	    untwoweapon();
	} else if (!could_twoweap(youmonst.data)) {
	    untwoweapon();
	}
    }
}